

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O2

void __thiscall Clasp::BasicSatConfig::prepare(BasicSatConfig *this,SharedContext *ctx)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint32 uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = (this->solver_).ebo_.size;
  uVar2 = (this->search_).ebo_.size;
  uVar7 = 0;
  uVar6 = 0;
  for (lVar5 = 0; (ulong)uVar1 * 0x1c - lVar5 != 0; lVar5 = lVar5 + 0x1c) {
    uVar4 = SolverParams::prepare
                      ((SolverParams *)
                       (&(((this->solver_).ebo_.buf)->super_SolverStrategies).field_0x0 + lVar5));
    uVar6 = uVar4 | uVar6;
    uVar3 = (ulong)uVar7 % (ulong)uVar2;
    SolveParams::prepare
              ((this->search_).ebo_.buf + uVar3,
               (*(ulong *)(&(((this->solver_).ebo_.buf)->super_SolverStrategies).field_0x0 + lVar5)
                >> 0x33 & 1) == 0);
    if (((*(ushort *)(&(((this->solver_).ebo_.buf)->super_SolverStrategies).field_0x4 + lVar5) &
         0x180) == 0) && (((uint)(this->search_).ebo_.buf[uVar3].reduce.strategy & 0x7f) != 0)) {
      uVar6 = uVar6 | 8;
    }
    uVar7 = uVar7 + 1;
  }
  if ((uVar6 & 1) != 0) {
    SharedContext::warn(ctx,"Selected heuristic requires lookback strategy!");
  }
  if ((uVar6 & 2) != 0) {
    SharedContext::warn(ctx,"Heuristic \'Unit\' implies lookahead. Using \'atom\'.");
  }
  if ((uVar6 & 4) != 0) {
    SharedContext::warn(ctx,"Domain options require heuristic \'Domain\'!");
  }
  if ((uVar6 & 8) == 0) {
    return;
  }
  SharedContext::warn(ctx,"Deletion protection requires LBD updates, which are off!");
  return;
}

Assistant:

void BasicSatConfig::prepare(SharedContext& ctx) {
	uint32 warn = 0;
	for (uint32 i = 0, end = solver_.size(), mod = search_.size(); i != end; ++i) {
		warn |= solver_[i].prepare();
		warn |= search_[i%mod].prepare(solver_[i].search != SolverStrategies::no_learning);
		if (solver_[i].updateLbd == SolverStrategies::lbd_fixed && search_[i%mod].reduce.strategy.protect) { warn |= 8; }
	}
	if ((warn & 1) != 0) { ctx.warn("Selected heuristic requires lookback strategy!"); }
	if ((warn & 2) != 0) { ctx.warn("Heuristic 'Unit' implies lookahead. Using 'atom'."); }
	if ((warn & 4) != 0) { ctx.warn("Domain options require heuristic 'Domain'!"); }
	if ((warn & 8) != 0) { ctx.warn("Deletion protection requires LBD updates, which are off!"); }
}